

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTestMacros.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_35efd::TestCorrectlyReportsFixturesWithCtorsThatAssert::RunImpl
          (TestCorrectlyReportsFixturesWithCtorsThatAssert *this)

{
  TestResults *pTVar1;
  TestResults **ppTVar2;
  TestDetails **ppTVar3;
  Test *this_00;
  char *pcVar4;
  ScopedCurrentTest scopedResults;
  int failureCount;
  TestResults result;
  RecordingReporter reporter;
  TestDetails local_878;
  int local_858;
  int local_854;
  TestResults local_850;
  TestReporter local_838;
  undefined4 local_830;
  undefined1 local_82c;
  undefined1 local_72c;
  undefined4 local_62c;
  undefined1 local_628;
  int local_528;
  undefined1 local_524;
  undefined1 local_424;
  char local_324 [256];
  undefined4 local_224;
  undefined1 local_220;
  undefined1 local_120;
  undefined8 local_20;
  undefined8 uStack_18;
  undefined4 local_10;
  
  local_838._vptr_TestReporter = (_func_int **)&PTR__TestReporter_00150810;
  local_830 = 0;
  local_62c = 0;
  local_528 = 0;
  local_224 = 0;
  local_82c = 0;
  local_72c = 0;
  local_628 = 0;
  local_524 = 0;
  local_424 = 0;
  local_324[0] = '\0';
  local_220 = 0;
  local_120 = 0;
  local_20 = 0;
  uStack_18 = 0;
  local_10 = 0;
  UnitTest::TestResults::TestResults(&local_850,&local_838);
  ppTVar2 = UnitTest::CurrentTest::Results();
  local_878.suiteName = (char *)*ppTVar2;
  ppTVar3 = UnitTest::CurrentTest::Details();
  local_878.testName = (char *)*ppTVar3;
  ppTVar2 = UnitTest::CurrentTest::Results();
  *ppTVar2 = &local_850;
  this_00 = UnitTest::TestList::GetHead
                      ((TestList *)(anonymous_namespace)::ctorAssertFixtureTestList);
  UnitTest::Test::Run(this_00);
  ScopedCurrentTest::~ScopedCurrentTest((ScopedCurrentTest *)&local_878);
  local_854 = UnitTest::TestResults::GetFailedTestCount(&local_850);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_858 = 1;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_878,*ppTVar3,0xb7);
  UnitTest::CheckEqual<int,int>(pTVar1,&local_858,&local_854,&local_878);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_878,*ppTVar3,0xb8);
  UnitTest::CheckEqual<int,int>(pTVar1,&(anonymous_namespace)::FailingLine,&local_528,&local_878);
  pcVar4 = strstr(local_324,"assert failure");
  if (pcVar4 == (char *)0x0) {
    ppTVar2 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar2;
    ppTVar3 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_878,*ppTVar3,0xb9);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_878,"strstr(reporter.lastFailedMessage, \"assert failure\")");
  }
  UnitTest::TestReporter::~TestReporter(&local_838);
  return;
}

Assistant:

TEST_EX(DummyTest, list1)
{
}